

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O1

int __thiscall ncnn::LSTM_x86::create_pipeline(LSTM_x86 *this,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  _func_int *p_Var4;
  _func_int **pp_Var5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  size_t sVar13;
  size_t sVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  int *piVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  undefined4 *puVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  undefined4 *puVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  ulong uVar34;
  int iVar35;
  uint _c;
  ulong local_128;
  
  p_Var4 = this->_vptr_LSTM_x86[-3];
  _c = (*(int *)(p_Var4 + 0x40 + (long)&(this->weight_hc_data_packed).data) == 2) + 1;
  iVar20 = (int)((long)((ulong)(uint)((int)((long)*(int *)(p_Var4 + 0x3c +
                                                          (long)&(this->weight_hc_data_packed).data)
                                           / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)*(int *)(p_Var4 + 0x3c + (long)&(this->weight_hc_data_packed).data) /
                       (long)(int)_c & 0xffffffffU) /
                (long)*(int *)(p_Var4 + 0x44 + (long)&(this->weight_hc_data_packed).data));
  iVar35 = iVar20 + 3;
  if (-1 < iVar20) {
    iVar35 = iVar20;
  }
  Mat::create(&this->weight_xc_data_packed,iVar35 >> 2,
              *(int *)(p_Var4 + 0x44 + (long)&(this->weight_hc_data_packed).data),_c,0x10,4,
              (Allocator *)0x0);
  Mat::create(&this->bias_c_data_packed,
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data),
              1,_c,0x10,4,(Allocator *)0x0);
  local_128 = 0;
  Mat::create(&this->weight_hc_data_packed,
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data),
              *(int *)(this->_vptr_LSTM_x86[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data),
              _c,0x10,4,(Allocator *)0x0);
  pp_Var5 = this->_vptr_LSTM_x86;
  pvVar6 = (this->weight_xc_data_packed).data;
  iVar1 = (this->weight_xc_data_packed).w;
  sVar7 = (this->weight_xc_data_packed).elemsize;
  sVar8 = (this->weight_xc_data_packed).cstep;
  sVar9 = (this->bias_c_data_packed).cstep;
  sVar10 = (this->bias_c_data_packed).elemsize;
  pvVar11 = (this->bias_c_data_packed).data;
  iVar2 = (this->weight_hc_data_packed).w;
  pvVar12 = (this->weight_hc_data_packed).data;
  sVar13 = (this->weight_hc_data_packed).elemsize;
  sVar14 = (this->weight_hc_data_packed).cstep;
  do {
    p_Var4 = pp_Var5[-3];
    if (0 < *(int *)(p_Var4 + 0x44 + (long)&(this->weight_hc_data_packed).data)) {
      lVar15 = *(long *)(&this->field_0x138 + (long)p_Var4);
      lVar30 = *(long *)(&this->field_0x1b0 + (long)p_Var4) * local_128 *
               *(long *)(&this->field_0x180 + (long)p_Var4) +
               *(long *)(&this->field_0x170 + (long)p_Var4);
      lVar16 = *(long *)(&this->field_0xf0 + (long)p_Var4);
      lVar23 = (long)*(int *)(&this->field_0x19c + (long)p_Var4) *
               *(long *)(&this->field_0x180 + (long)p_Var4);
      puVar25 = (undefined4 *)(sVar9 * sVar10 * local_128 + (long)pvVar11);
      lVar24 = (long)*(int *)(&this->field_0x10c + (long)p_Var4);
      lVar26 = (long)*(int *)(&this->field_0x154 + (long)p_Var4);
      lVar32 = *(long *)(&this->field_0x168 + (long)p_Var4) * local_128;
      lVar17 = *(long *)(&this->field_0x128 + (long)p_Var4);
      lVar33 = lVar32 * lVar15 + lVar17;
      lVar18 = *(long *)(&this->field_0xe0 + (long)p_Var4);
      lVar27 = *(long *)(&this->field_0x120 + (long)p_Var4) * local_128;
      lVar28 = lVar27 * lVar16 + lVar18;
      lVar22 = 0;
      do {
        *puVar25 = *(undefined4 *)(lVar30 + lVar22 * 4);
        puVar25[1] = *(undefined4 *)(lVar30 + lVar23 + lVar22 * 4);
        puVar25[2] = *(undefined4 *)(lVar30 + lVar23 * 2 + lVar22 * 4);
        puVar25[3] = *(undefined4 *)(lVar23 * 3 + lVar30 + lVar22 * 4);
        iVar3 = *(int *)(pp_Var5[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data);
        iVar21 = (int)lVar22;
        if (3 < iVar20) {
          puVar29 = (undefined4 *)
                    ((long)pvVar6 + (long)iVar1 * sVar7 * lVar22 + sVar8 * sVar7 * local_128);
          uVar34 = 0;
          do {
            *puVar29 = *(undefined4 *)(lVar33 + uVar34 * 4);
            puVar29[1] = *(undefined4 *)
                          (((iVar3 + iVar21) * lVar26 + lVar32) * lVar15 + lVar17 + uVar34 * 4);
            puVar29[2] = *(undefined4 *)
                          (((iVar3 * 2 + iVar21) * lVar26 + lVar32) * lVar15 + lVar17 + uVar34 * 4);
            puVar29[3] = *(undefined4 *)
                          (((iVar21 + iVar3 * 3) * lVar26 + lVar32) * lVar15 + lVar17 + uVar34 * 4);
            puVar29 = puVar29 + 4;
            uVar34 = uVar34 + 1;
          } while ((uint)(iVar35 >> 2) != uVar34);
        }
        if (0 < *(int *)(pp_Var5[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data)) {
          puVar29 = (undefined4 *)
                    ((long)pvVar12 + (long)iVar2 * sVar13 * lVar22 + sVar14 * sVar13 * local_128);
          lVar31 = 0;
          do {
            *puVar29 = *(undefined4 *)(lVar28 + lVar31 * 4);
            puVar29[1] = *(undefined4 *)
                          (((iVar3 + iVar21) * lVar24 + lVar27) * lVar16 + lVar18 + lVar31 * 4);
            puVar29[2] = *(undefined4 *)
                          (((iVar3 * 2 + iVar21) * lVar24 + lVar27) * lVar16 + lVar18 + lVar31 * 4);
            puVar29[3] = *(undefined4 *)
                          (((iVar3 * 3 + iVar21) * lVar24 + lVar27) * lVar16 + lVar18 + lVar31 * 4);
            lVar31 = lVar31 + 1;
            puVar29 = puVar29 + 4;
          } while (lVar31 < *(int *)(pp_Var5[-3] + 0x38 + (long)&(this->weight_hc_data_packed).data)
                  );
        }
        puVar25 = puVar25 + 4;
        lVar22 = lVar22 + 1;
        lVar33 = lVar33 + lVar15 * lVar26;
        lVar28 = lVar28 + lVar16 * lVar24;
      } while (lVar22 < *(int *)(pp_Var5[-3] + 0x44 + (long)&(this->weight_hc_data_packed).data));
    }
    local_128 = local_128 + 1;
  } while (local_128 != _c);
  if (opt->lightmode != false) {
    p_Var4 = this->_vptr_LSTM_x86[-3];
    piVar19 = *(int **)(&this->field_0x130 + (long)p_Var4);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (*(long **)(&this->field_0x148 + (long)p_Var4) == (long *)0x0) {
          if (*(void **)(&this->field_0x128 + (long)p_Var4) != (void *)0x0) {
            free(*(void **)(&this->field_0x128 + (long)p_Var4));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x148 + (long)p_Var4) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x168 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x134 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x13c + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x128 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x130 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x150 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x158 + (long)p_Var4) = 0;
    *(undefined4 *)(&this->field_0x160 + (long)p_Var4) = 0;
    p_Var4 = this->_vptr_LSTM_x86[-3];
    piVar19 = *(int **)(&this->field_0x178 + (long)p_Var4);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (*(long **)(&this->field_0x190 + (long)p_Var4) == (long *)0x0) {
          if (*(void **)(&this->field_0x170 + (long)p_Var4) != (void *)0x0) {
            free(*(void **)(&this->field_0x170 + (long)p_Var4));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x190 + (long)p_Var4) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1b0 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x17c + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x184 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x170 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x178 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x198 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var4) = 0;
    *(undefined4 *)(&this->field_0x1a8 + (long)p_Var4) = 0;
    p_Var4 = this->_vptr_LSTM_x86[-3];
    piVar19 = *(int **)(&this->field_0xe8 + (long)p_Var4);
    if (piVar19 != (int *)0x0) {
      LOCK();
      *piVar19 = *piVar19 + -1;
      UNLOCK();
      if (*piVar19 == 0) {
        if (*(long **)(&this->field_0x100 + (long)p_Var4) == (long *)0x0) {
          if (*(void **)(&this->field_0xe0 + (long)p_Var4) != (void *)0x0) {
            free(*(void **)(&this->field_0xe0 + (long)p_Var4));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x100 + (long)p_Var4) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x120 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0xec + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0xf4 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0xe0 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0xe8 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x108 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x110 + (long)p_Var4) = 0;
    *(undefined4 *)(&this->field_0x118 + (long)p_Var4) = 0;
  }
  return 0;
}

Assistant:

int LSTM_x86::create_pipeline(const Option& opt)
{
    // pack IFOG
    int num_directions = direction == 2 ? 2 : 1;
    int size = weight_data_size / num_directions / hidden_size / 4;

#if __AVX__
    weight_xc_data_packed.create(size, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size / 2 + hidden_size % 2, num_directions, 32u, 8);
#else
    weight_xc_data_packed.create(size, hidden_size, num_directions, 16u, 4);
    bias_c_data_packed.create(hidden_size, 1, num_directions, 16u, 4);
    weight_hc_data_packed.create(num_output, hidden_size, num_directions, 16u, 4);
#endif

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int dr = 0; dr < num_directions; dr++)
    {
        const Mat weight_xc = weight_xc_data.channel(dr);
        const Mat bias_c = bias_c_data.channel(dr);
        const Mat weight_hc = weight_hc_data.channel(dr);

        Mat weight_xc_data_packed_dr = weight_xc_data_packed.channel(dr);
        Mat bias_c_data_packed_dr = bias_c_data_packed.channel(dr);
        Mat weight_hc_data_packed_dr = weight_hc_data_packed.channel(dr);

        const float* bias_c_I = bias_c.row(0);
        const float* bias_c_F = bias_c.row(1);
        const float* bias_c_O = bias_c.row(2);
        const float* bias_c_G = bias_c.row(3);

        float* bias_c_IFOG = bias_c_data_packed_dr.row(0);

        int q = 0;
#if __AVX__
        for (; q + 1 < hidden_size; q += 2)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];
            bias_c_IFOG[4] = bias_c_I[q + 1];
            bias_c_IFOG[5] = bias_c_F[q + 1];
            bias_c_IFOG[6] = bias_c_O[q + 1];
            bias_c_IFOG[7] = bias_c_G[q + 1];

            bias_c_IFOG += 8;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);
            const float* weight_xc_I_1 = weight_xc.row(hidden_size * 0 + q + 1);
            const float* weight_xc_F_1 = weight_xc.row(hidden_size * 1 + q + 1);
            const float* weight_xc_O_1 = weight_xc.row(hidden_size * 2 + q + 1);
            const float* weight_xc_G_1 = weight_xc.row(hidden_size * 3 + q + 1);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);
            const float* weight_hc_I_1 = weight_hc.row(hidden_size * 0 + q + 1);
            const float* weight_hc_F_1 = weight_hc.row(hidden_size * 1 + q + 1);
            const float* weight_hc_O_1 = weight_hc.row(hidden_size * 2 + q + 1);
            const float* weight_hc_G_1 = weight_hc.row(hidden_size * 3 + q + 1);

            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2);

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];
                weight_xc_IFOG[4] = weight_xc_I_1[i];
                weight_xc_IFOG[5] = weight_xc_F_1[i];
                weight_xc_IFOG[6] = weight_xc_O_1[i];
                weight_xc_IFOG[7] = weight_xc_G_1[i];

                weight_xc_IFOG += 8;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];
                weight_hc_IFOG[4] = weight_hc_I_1[i];
                weight_hc_IFOG[5] = weight_hc_F_1[i];
                weight_hc_IFOG[6] = weight_hc_O_1[i];
                weight_hc_IFOG[7] = weight_hc_G_1[i];

                weight_hc_IFOG += 8;
            }
        }
#endif // __AVX__
        for (; q < hidden_size; q++)
        {
            bias_c_IFOG[0] = bias_c_I[q];
            bias_c_IFOG[1] = bias_c_F[q];
            bias_c_IFOG[2] = bias_c_O[q];
            bias_c_IFOG[3] = bias_c_G[q];

            bias_c_IFOG += 4;

            const float* weight_xc_I = weight_xc.row(hidden_size * 0 + q);
            const float* weight_xc_F = weight_xc.row(hidden_size * 1 + q);
            const float* weight_xc_O = weight_xc.row(hidden_size * 2 + q);
            const float* weight_xc_G = weight_xc.row(hidden_size * 3 + q);

            const float* weight_hc_I = weight_hc.row(hidden_size * 0 + q);
            const float* weight_hc_F = weight_hc.row(hidden_size * 1 + q);
            const float* weight_hc_O = weight_hc.row(hidden_size * 2 + q);
            const float* weight_hc_G = weight_hc.row(hidden_size * 3 + q);

#if __AVX__
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q / 2 + q % 2);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q / 2 + q % 2);
#else
            float* weight_xc_IFOG = weight_xc_data_packed_dr.row(q);
            float* weight_hc_IFOG = weight_hc_data_packed_dr.row(q);
#endif

            for (int i = 0; i < size; i++)
            {
                weight_xc_IFOG[0] = weight_xc_I[i];
                weight_xc_IFOG[1] = weight_xc_F[i];
                weight_xc_IFOG[2] = weight_xc_O[i];
                weight_xc_IFOG[3] = weight_xc_G[i];

                weight_xc_IFOG += 4;
            }

            for (int i = 0; i < num_output; i++)
            {
                weight_hc_IFOG[0] = weight_hc_I[i];
                weight_hc_IFOG[1] = weight_hc_F[i];
                weight_hc_IFOG[2] = weight_hc_O[i];
                weight_hc_IFOG[3] = weight_hc_G[i];

                weight_hc_IFOG += 4;
            }
        }
    }

    if (opt.lightmode)
    {
        weight_xc_data.release();
        bias_c_data.release();
        weight_hc_data.release();
    }

    return 0;
}